

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O3

void __thiscall ByteData_Serialize_Test::TestBody(ByteData_Serialize_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppuVar2;
  pointer puVar3;
  _Alloc_hider lhs;
  bool bVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  pointer *ppuVar7;
  long lVar8;
  char *pcVar9;
  ulong *puVar10;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  test_vector;
  allocator_type local_46a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_469;
  string local_468;
  ByteData local_448;
  long lStack_430;
  ulong *local_428;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  ulong local_418;
  long lStack_410;
  ByteData local_408;
  undefined8 uStack_3f0;
  ByteData local_3e8;
  ulong *local_3c8;
  undefined8 local_3c0;
  ulong local_3b8;
  long lStack_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 local_398;
  undefined7 uStack_397;
  undefined8 uStack_390;
  ulong *local_388;
  undefined8 local_380;
  ulong local_378;
  long lStack_370;
  undefined1 *local_368;
  undefined8 local_360;
  undefined1 local_358;
  undefined7 uStack_357;
  undefined8 uStack_350;
  ulong *local_348;
  undefined8 local_340;
  ulong local_338;
  long lStack_330;
  undefined1 *local_328;
  undefined8 local_320;
  undefined1 local_318;
  undefined7 uStack_317;
  undefined8 uStack_310;
  ulong *local_308;
  undefined8 local_300;
  ulong local_2f8;
  long lStack_2f0;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  undefined8 uStack_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [16];
  undefined1 *local_268;
  undefined8 local_260;
  undefined1 local_258 [16];
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  pointer *local_1c8;
  long local_1c0;
  pointer local_1b8;
  long lStack_1b0;
  pointer *local_1a8;
  pointer local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  undefined8 uStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  undefined8 uStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[1],_const_char_(&)[3],_true>
            (&local_228,(char (*) [1])0x5a7ade,(char (*) [3])0x585451);
  paVar1 = &local_468.field_2;
  local_468._M_string_length = 0;
  local_468.field_2._M_local_buf[0] = '\0';
  local_468._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::reserve((ulong)&local_468);
  std::__cxx11::string::resize((ulong)&local_468,'\x02');
  local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)local_3e8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  std::__cxx11::string::reserve((ulong)&local_3e8);
  std::__cxx11::string::resize((ulong)&local_3e8,'\x02');
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x56c54b);
  ppuVar2 = &local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  ppuVar7 = (pointer *)(plVar5 + 2);
  if ((pointer *)*plVar5 == ppuVar7) {
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *ppuVar7;
    lStack_430 = plVar5[3];
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar2;
  }
  else {
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *ppuVar7;
    local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar5;
  }
  local_1c0 = plVar5[1];
  *plVar5 = (long)ppuVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1e8 = &local_1d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p == paVar1) {
    local_1d8._8_8_ = local_468.field_2._8_8_;
  }
  else {
    local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p;
  }
  local_1d8._M_allocated_capacity._1_7_ = local_468.field_2._M_allocated_capacity._1_7_;
  local_1d8._M_local_buf[0] = local_468.field_2._M_local_buf[0];
  local_1c8 = &local_1b8;
  local_1e0 = local_468._M_string_length;
  local_468._M_string_length = 0;
  local_468.field_2._M_local_buf[0] = '\0';
  if ((pointer *)
      local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == ppuVar2) {
    lStack_1b0 = lStack_430;
  }
  else {
    local_1c8 = (pointer *)
                local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  }
  local_1b8 = local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)local_448.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  ppuVar7 = &local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_468._M_dataplus._M_p = (pointer)paVar1;
  local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar2;
  local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar7;
  std::__cxx11::string::reserve((ulong)&local_408);
  std::__cxx11::string::resize((ulong)&local_408,-10);
  local_288 = local_278;
  local_280 = 0;
  local_278[0] = 0;
  std::__cxx11::string::reserve((ulong)&local_288);
  std::__cxx11::string::resize((ulong)&local_288,-10);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,0x5206f6);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_418 = *puVar10;
    lStack_410 = plVar5[3];
    local_428 = &local_418;
  }
  else {
    local_418 = *puVar10;
    local_428 = (ulong *)*plVar5;
  }
  local_180 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1a8 = (pointer *)&local_198;
  if ((pointer *)
      local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == ppuVar7) {
    uStack_190 = uStack_3f0;
  }
  else {
    local_1a8 = (pointer *)
                local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  }
  _local_198 = (pointer)CONCAT71(local_408.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_408.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
  local_188 = &local_178;
  local_1a0 = local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  if (local_428 == &local_418) {
    lStack_170 = lStack_410;
  }
  else {
    local_188 = local_428;
  }
  local_178 = local_418;
  local_420.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_418 = local_418 & 0xffffffffffffff00;
  local_320 = 0;
  local_318 = 0;
  local_428 = &local_418;
  local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar7;
  local_328 = &local_318;
  std::__cxx11::string::reserve((ulong)&local_328);
  std::__cxx11::string::resize((ulong)&local_328,-8);
  local_2a8 = local_298;
  local_2a0 = 0;
  local_298[0] = 0;
  std::__cxx11::string::reserve((ulong)&local_2a8);
  std::__cxx11::string::resize((ulong)&local_2a8,-8);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x564397);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_338 = *puVar10;
    lStack_330 = plVar5[3];
    local_348 = &local_338;
  }
  else {
    local_338 = *puVar10;
    local_348 = (ulong *)*plVar5;
  }
  local_140 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_168 = &local_158;
  if (local_328 == &local_318) {
    uStack_150 = uStack_310;
  }
  else {
    local_168 = local_328;
  }
  _local_158 = CONCAT71(uStack_317,local_318);
  local_148 = &local_138;
  local_160 = local_320;
  local_320 = 0;
  local_318 = 0;
  if (local_348 == &local_338) {
    lStack_130 = lStack_330;
  }
  else {
    local_148 = local_348;
  }
  local_138 = local_338;
  local_340 = 0;
  local_338 = local_338 & 0xffffffffffffff00;
  local_360 = 0;
  local_358 = 0;
  local_368 = &local_358;
  local_348 = &local_338;
  local_328 = &local_318;
  std::__cxx11::string::reserve((ulong)&local_368);
  std::__cxx11::string::resize((ulong)&local_368,-6);
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  std::__cxx11::string::reserve((ulong)&local_2c8);
  std::__cxx11::string::resize((ulong)&local_2c8,-6);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0x4cee41);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_378 = *puVar10;
    lStack_370 = plVar5[3];
    local_388 = &local_378;
  }
  else {
    local_378 = *puVar10;
    local_388 = (ulong *)*plVar5;
  }
  local_100 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_128 = &local_118;
  if (local_368 == &local_358) {
    uStack_110 = uStack_350;
  }
  else {
    local_128 = local_368;
  }
  _local_118 = CONCAT71(uStack_357,local_358);
  local_108 = &local_f8;
  local_120 = local_360;
  local_360 = 0;
  local_358 = 0;
  if (local_388 == &local_378) {
    lStack_f0 = lStack_370;
  }
  else {
    local_108 = local_388;
  }
  local_f8 = local_378;
  local_380 = 0;
  local_378 = local_378 & 0xffffffffffffff00;
  local_3a0 = 0;
  local_398 = 0;
  local_3a8 = &local_398;
  local_388 = &local_378;
  local_368 = &local_358;
  std::__cxx11::string::reserve((ulong)&local_3a8);
  std::__cxx11::string::resize((ulong)&local_3a8,-4);
  local_240 = 0;
  local_238[0] = 0;
  local_248 = local_238;
  std::__cxx11::string::reserve((ulong)&local_248);
  std::__cxx11::string::resize((ulong)&local_248,-4);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x4cee48);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_3b8 = *puVar10;
    lStack_3b0 = plVar5[3];
    local_3c8 = &local_3b8;
  }
  else {
    local_3b8 = *puVar10;
    local_3c8 = (ulong *)*plVar5;
  }
  local_c0 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_e8 = &local_d8;
  if (local_3a8 == &local_398) {
    uStack_d0 = uStack_390;
  }
  else {
    local_e8 = local_3a8;
  }
  _local_d8 = CONCAT71(uStack_397,local_398);
  local_c8 = &local_b8;
  local_e0 = local_3a0;
  local_3a0 = 0;
  local_398 = 0;
  if (local_3c8 == &local_3b8) {
    lStack_b0 = lStack_3b0;
  }
  else {
    local_c8 = local_3c8;
  }
  local_b8 = local_3b8;
  local_3c0 = 0;
  local_3b8 = local_3b8 & 0xffffffffffffff00;
  local_2e0 = 0;
  local_2d8 = 0;
  local_3c8 = &local_3b8;
  local_3a8 = &local_398;
  local_2e8 = &local_2d8;
  std::__cxx11::string::reserve((ulong)&local_2e8);
  std::__cxx11::string::resize((ulong)&local_2e8,-2);
  local_260 = 0;
  local_258[0] = 0;
  local_268 = local_258;
  std::__cxx11::string::reserve((ulong)&local_268);
  std::__cxx11::string::resize((ulong)&local_268,-2);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x4cee4f);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_2f8 = *puVar10;
    lStack_2f0 = plVar5[3];
    local_308 = &local_2f8;
  }
  else {
    local_2f8 = *puVar10;
    local_308 = (ulong *)*plVar5;
  }
  local_80 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_a8 = &local_98;
  if (local_2e8 == &local_2d8) {
    uStack_90 = uStack_2d0;
  }
  else {
    local_a8 = local_2e8;
  }
  _local_98 = CONCAT71(uStack_2d7,local_2d8);
  puVar10 = &local_78;
  local_a0 = local_2e0;
  local_2e0 = 0;
  local_2d8 = 0;
  if (local_308 == &local_2f8) {
    lStack_70 = lStack_2f0;
    local_88 = puVar10;
  }
  else {
    local_88 = local_308;
  }
  local_78 = local_2f8;
  local_300 = 0;
  local_2f8 = local_2f8 & 0xffffffffffffff00;
  __l._M_len = 7;
  __l._M_array = &local_228;
  local_308 = &local_2f8;
  local_2e8 = &local_2d8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,&local_469,&local_46a);
  lVar8 = -0x1c0;
  do {
    if (puVar10 != (ulong *)puVar10[-2]) {
      operator_delete((ulong *)puVar10[-2]);
    }
    if (puVar10 + -4 != (ulong *)puVar10[-6]) {
      operator_delete((ulong *)puVar10[-6]);
    }
    puVar10 = puVar10 + -8;
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0);
  if (local_308 != &local_2f8) {
    operator_delete(local_308);
  }
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8);
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  if (local_288 != local_278) {
    operator_delete(local_288);
  }
  if ((pointer *)
      local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_408.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_448.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_3e8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  cfd::core::ByteData::ByteData(&local_448);
  cfd::core::ByteData::ByteData(&local_3e8);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          cfd::core::ByteData::ByteData((ByteData *)&local_228,(string *)(p_Var6 + 1));
          puVar3 = local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_228.first._M_dataplus._M_p;
          local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_228.first._M_string_length;
          local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.first.field_2._M_allocated_capacity;
          local_228.first._M_dataplus._M_p = (pointer)0x0;
          local_228.first._M_string_length = 0;
          local_228.first.field_2._M_allocated_capacity = 0;
          if ((pointer *)puVar3 != (pointer *)0x0) {
            operator_delete(puVar3);
            if ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0) {
              operator_delete(local_228.first._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_228);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_468,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                   ,0x82,
                   "Expected: data = ByteData(citr->first) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&local_228)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
        if ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0)) {
            (**(code **)(*(pointer *)local_228.first._M_dataplus._M_p + 8))();
          }
        }
      }
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          cfd::core::ByteData::Serialize((ByteData *)&local_228,&local_3e8);
          puVar3 = local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_228.first._M_dataplus._M_p;
          local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_228.first._M_string_length;
          local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.first.field_2._M_allocated_capacity;
          local_228.first._M_dataplus._M_p = (pointer)0x0;
          local_228.first._M_string_length = 0;
          local_228.first.field_2._M_allocated_capacity = 0;
          if ((pointer *)puVar3 != (pointer *)0x0) {
            operator_delete(puVar3);
            if ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0) {
              operator_delete(local_228.first._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_228);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_468,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                   ,0x83,
                   "Expected: serialized = data.Serialize() doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&local_228)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
        if ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0)) {
            (**(code **)(*(pointer *)local_228.first._M_dataplus._M_p + 8))();
          }
        }
      }
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_228.first,&local_448);
      lhs._M_p = local_228.first._M_dataplus._M_p;
      cfd::core::ByteData::ByteData(&local_408,(string *)(p_Var6 + 2));
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_468,&local_408);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_428,"serialized.GetHex().c_str()",
                 "ByteData(citr->second).GetHex().c_str()",lhs._M_p,local_468._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p);
      }
      if ((pointer *)
          local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_408.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
        operator_delete(local_228.first._M_dataplus._M_p);
      }
      if (local_428._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_228);
        pcVar9 = "";
        if (local_420.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((local_420.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_468,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                   ,0x84,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&local_228)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
        if ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && ((pointer *)local_228.first._M_dataplus._M_p != (pointer *)0x0)) {
            (**(code **)(*(pointer *)local_228.first._M_dataplus._M_p + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_420,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_468._M_dataplus._M_p = (pointer)cfd::core::ByteData::GetSerializeSize(&local_3e8);
      local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)cfd::core::ByteData::GetDataSize(&local_448);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_228,"data.GetSerializeSize()","serialized.GetDataSize()",
                 (unsigned_long *)&local_468,(unsigned_long *)&local_408);
      if ((char)local_228.first._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_468);
        pcVar9 = "";
        if ((pointer)local_228.first._M_string_length != (pointer)0x0) {
          pcVar9 = *(char **)local_228.first._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_408,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                   ,0x85,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_408,(Message *)&local_468)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_468._M_dataplus._M_p + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_228.first._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
  }
  if ((pointer *)
      local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_3e8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_448.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_448.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

TEST(ByteData, Serialize) {
  auto blank_str = [](uint16_t len){
    std::string ret;
    ret.reserve(len*2);
    ret.resize(len*2, '0');
    return ret;
  };

  // FIXME(fujita-cg):  32/64byte長については、capasityの限界によりテスト不可
  //                    capasityが解決したらテストを修正する
  const uint64_t vi_max8 = 252;
  const uint64_t vi_max16 = std::numeric_limits<uint16_t>::max();
  // const uint64_t vi_max32 = std::numeric_limits<uint32_t>::max();
  // const uint64_t vi_max64 = std::numeric_limits<uint64_t>::max();
  std::map<std::string, std::string> test_vector = {
    {"", "00"},
    {blank_str(1), "01" + blank_str(1)},
    {blank_str(vi_max8-1), ("fb" + blank_str(vi_max8-1))},
    {blank_str(vi_max8), ("fc" + blank_str(vi_max8))},
    {blank_str(vi_max8+1), ("fdfd00" + blank_str(vi_max8+1))},
    {blank_str(vi_max16-1), ("fdfeff" + blank_str(vi_max16-1))},
    {blank_str(vi_max16), ("fdffff" + blank_str(vi_max16))},
    // {blank_str(vi_max16+1), ("fe00000100" + blank_str(vi_max16+1))},
    // {blank_str(vi_max32-1), ("fefeffffff" + blank_str(vi_max32-1))},
    // {blank_str(vi_max32), ("feffffffff" + blank_str(vi_max32))},
    // {blank_str(vi_max32+1), ("ff0000000001000000" + blank_str(vi_max32+1))},
    // {blank_str(vi_max64-1), ("fffeffffffffffffff" + blank_str(vi_max64-1))},
    // {blank_str(vi_max64), ("ffffffffffffffffff" + blank_str(vi_max64))},
  };

  ByteData serialized;
  ByteData data;
  decltype(test_vector)::const_iterator citr = test_vector.cbegin();
  while (citr != test_vector.cend()) {
    EXPECT_NO_THROW(data = ByteData(citr->first));
    EXPECT_NO_THROW(serialized = data.Serialize());
    EXPECT_STREQ(serialized.GetHex().c_str(), ByteData(citr->second).GetHex().c_str());
    EXPECT_EQ(data.GetSerializeSize(), serialized.GetDataSize());
    ++citr;
  }
}